

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_head_service(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  wchar_t ret;
  size_t block_flags_local;
  archive_entry *entry_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  a_local._4_4_ = process_head_file(a,rar,entry,block_flags);
  if (a_local._4_4_ == L'\0') {
    (rar->file).field_0x20 = (rar->file).field_0x20 & 0xfd | 2;
    a_local._4_4_ = rar5_read_data_skip(a);
    if (a_local._4_4_ == L'\0') {
      a_local._4_4_ = L'\xfffffff6';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int process_head_service(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	/* Process this SERVICE block the same way as FILE blocks. */
	int ret = process_head_file(a, rar, entry, block_flags);
	if(ret != ARCHIVE_OK)
		return ret;

	rar->file.service = 1;

	/* But skip the data part automatically. It's no use for the user
	 * anyway.  It contains only service data, not even needed to
	 * properly unpack the file. */
	ret = rar5_read_data_skip(a);
	if(ret != ARCHIVE_OK)
		return ret;

	/* After skipping, try parsing another block automatically. */
	return ARCHIVE_RETRY;
}